

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O0

void __thiscall cmFindCommon::SelectDefaultRootPathMode(cmFindCommon *this)

{
  bool bVar1;
  string *psVar2;
  undefined1 local_50 [8];
  string rootPathMode;
  string findRootPathVar;
  cmFindCommon *this_local;
  
  psVar2 = (string *)((long)&rootPathMode.field_2 + 8);
  cmStrCat<char_const(&)[27],std::__cxx11::string&>
            (psVar2,(char (*) [27])"CMAKE_FIND_ROOT_PATH_MODE_",&this->CMakePathName);
  psVar2 = cmMakefile::GetSafeDefinition(this->Makefile,psVar2);
  std::__cxx11::string::string((string *)local_50,(string *)psVar2);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50,"NEVER");
  if (bVar1) {
    this->FindRootPathMode = RootPathModeNever;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"ONLY");
    if (bVar1) {
      this->FindRootPathMode = RootPathModeOnly;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_50,"BOTH");
      if (bVar1) {
        this->FindRootPathMode = RootPathModeBoth;
      }
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(rootPathMode.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmFindCommon::SelectDefaultRootPathMode()
{
  // Check the policy variable for this find command type.
  std::string findRootPathVar =
    cmStrCat("CMAKE_FIND_ROOT_PATH_MODE_", this->CMakePathName);
  std::string rootPathMode =
    this->Makefile->GetSafeDefinition(findRootPathVar);
  if (rootPathMode == "NEVER") {
    this->FindRootPathMode = RootPathModeNever;
  } else if (rootPathMode == "ONLY") {
    this->FindRootPathMode = RootPathModeOnly;
  } else if (rootPathMode == "BOTH") {
    this->FindRootPathMode = RootPathModeBoth;
  }
}